

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::strftime::operator()(strftime *this,ostream *out)

{
  ulong uVar1;
  ostream *in_RSI;
  ostringstream ss;
  ostream *in_stack_fffffffffffffde8;
  streamable *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  long local_188 [47];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ios::copyfmt((ios *)((long)local_188 + *(long *)(local_188[0] + -0x18)));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    booster::locale::as::time_zone(in_stack_fffffffffffffe08);
    booster::locale::as::details::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
               (set_timezone *)in_stack_fffffffffffffde8);
    booster::locale::as::details::set_timezone::~set_timezone((set_timezone *)0x40d523);
  }
  std::ostream::operator<<(local_188,booster::locale::as::datetime);
  booster::locale::as::ftime<char>(in_stack_fffffffffffffe08);
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0,
             (add_ftime<char> *)in_stack_fffffffffffffde8);
  booster::locale::as::details::add_ftime<char>::~add_ftime((add_ftime<char> *)0x40d5ac);
  streamable::operator()(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_10,(string *)&stack0xfffffffffffffe08);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return;
}

Assistant:

void strftime::operator()(std::ostream &out) const
	{
		std::ostringstream ss;
		ss.copyfmt(out);
		if(!tz_.empty())
			ss << cppcms::locale::as::time_zone(tz_);
		ss << cppcms::locale::as::datetime << cppcms::locale::as::ftime(format_);
		time_(ss);
		out << ss.str();
	}